

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O2

void __thiscall
vkt::image::anon_unknown_0::SizeTestInstance::SizeTestInstance
          (SizeTestInstance *this,Context *context,Texture *texture,VkFormat format)

{
  undefined1 auVar1 [16];
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  Buffer *this_00;
  ulong in_stack_ffffffffffffff90;
  VkBufferCreateInfo local_68;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__SizeTestInstance_00c06e58;
  Texture::Texture(&this->m_texture,texture);
  this->m_format = format;
  this->m_resultBufferSizeBytes = 0xc;
  (this->m_resultBuffer).
  super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
       (Buffer *)0x0;
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  this_00 = (Buffer *)operator_new(0x30);
  makeBufferCreateInfo(&local_68,this->m_resultBufferSizeBytes,0x20);
  image::Buffer::Buffer(this_00,vk,device,allocator,&local_68,(MemoryRequirement)0x1);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_stack_ffffffffffffff90;
  de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::assignData
            (&(this->m_resultBuffer).
              super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>,
             (PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>)(auVar1 << 0x40))
  ;
  de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::~UniqueBase
            ((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)
             &stack0xffffffffffffff88);
  return;
}

Assistant:

SizeTestInstance::SizeTestInstance (Context& context, const Texture& texture, const VkFormat format)
	: TestInstance				(context)
	, m_texture					(texture)
	, m_format					(format)
	, m_resultBufferSizeBytes	(3 * sizeof(deUint32))	// ivec3 in shader
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	const VkDevice			device		= m_context.getDevice();
	Allocator&				allocator	= m_context.getDefaultAllocator();

	// Create an SSBO for shader output.

	m_resultBuffer = de::MovePtr<Buffer>(new Buffer(
		vk, device, allocator,
		makeBufferCreateInfo(m_resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT),
		MemoryRequirement::HostVisible));
}